

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runCCDPP_MPI.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  time_t tVar4;
  int iVar5;
  Parameter parameter;
  CCDPP_MPI ccdpp;
  Parameter local_1a0;
  CCDPP_MPI local_130;
  
  paVar1 = &local_1a0.meta_path.field_2;
  paVar2 = &local_1a0.output_path.field_2;
  local_1a0.meta_path._M_string_length = 0;
  local_1a0.meta_path.field_2._M_local_buf[0] = '\0';
  local_1a0.output_path._M_string_length = 0;
  local_1a0.output_path.field_2._M_local_buf[0] = '\0';
  local_1a0.meta_path._M_dataplus._M_p = (pointer)paVar1;
  local_1a0.output_path._M_dataplus._M_p = (pointer)paVar2;
  bVar3 = Parameter::create(&local_1a0,argc,argv);
  iVar5 = 1;
  if (bVar3) {
    Parameter::print_parameters(&local_1a0);
    tVar4 = time((time_t *)0x0);
    srand((uint)tVar4);
    CCDPP_MPI::CCDPP_MPI(&local_130,&local_1a0);
    CCDPP_MPI::train(&local_130);
    CCDPP_MPI::predict_test_data(&local_130);
    if (local_1a0.output == true) {
      CCDPP_MPI::output(&local_130);
    }
    CCDPP_MPI::~CCDPP_MPI(&local_130);
    iVar5 = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.output_path._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a0.output_path._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.meta_path._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a0.meta_path._M_dataplus._M_p);
  }
  return iVar5;
}

Assistant:

int main(int argc, char **argv) {
    Parameter parameter;
    if (!parameter.create(argc, argv)) {
        return 1;
    }

    parameter.print_parameters();
    RandomUtil::init_seed();

    CCDPP_MPI ccdpp(&parameter);
    ccdpp.train();
    ccdpp.predict_test_data();

    if (parameter.output) {
        ccdpp.output();
    }

    return 0;
}